

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::AttachFile(cmCTestTestHandler *this,cmXMLWriter *xml,string *file,string *name)

{
  string measurement_name;
  string fname;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  cmCTest::Base64GzipEncodeFile(&local_38,(this->super_cmCTestGenericHandler).CTest,file);
  cmsys::SystemTools::GetFilenameName(&local_58,file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"NamedMeasurement",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(xml,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,(string *)name);
  if (local_98._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_98);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_98);
  cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
  cmXMLWriter::Attribute<char[9]>(xml,"compression",(char (*) [9])"tar/gzip");
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_58);
  cmXMLWriter::Attribute<char[5]>(xml,"type",(char (*) [5])0x6a090f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Value",&local_99);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCTestTestHandler::AttachFile(cmXMLWriter& xml, std::string const& file,
                                    std::string const& name)
{
  const std::string& base64 = this->CTest->Base64GzipEncodeFile(file);
  std::string const fname = cmSystemTools::GetFilenameName(file);
  xml.StartElement("NamedMeasurement");
  std::string measurement_name = name;
  if (measurement_name.empty()) {
    measurement_name = "Attached File";
  }
  xml.Attribute("name", measurement_name);
  xml.Attribute("encoding", "base64");
  xml.Attribute("compression", "tar/gzip");
  xml.Attribute("filename", fname);
  xml.Attribute("type", "file");
  xml.Element("Value", base64);
  xml.EndElement(); // NamedMeasurement
}